

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_base.cpp
# Opt level: O0

void mpp_data_update_v2(MppDataV2 *p,RK_S32 val)

{
  RK_S32 val_local;
  MppDataV2 *p_local;
  
  if (p->pos_ahead == 0) {
    if ((p == (MppDataV2 *)0x0) &&
       (_mpp_log_l(2,"rc_base","Assertion %s failed at %s:%d\n",(char *)0x0,"p","mpp_data_update_v2"
                   ,0x7b), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    if (p->pos_r == p->size) {
      p->pos_r = p->pos_r + -1;
      p->sum = p->sum - (long)(&p[1].size)[p->pos_w];
    }
    if ((p->size <= p->pos_r) &&
       (_mpp_log_l(2,"rc_base","Assertion %s failed at %s:%d\n",(char *)0x0,"p->pos_r < p->size",
                   "mpp_data_update_v2",0x80), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    (&p[1].size)[p->pos_w] = val;
    p->sum = (long)(&p[1].size)[p->pos_w] + p->sum;
    p->pos_w = p->pos_w + 1;
    p->pos_r = p->pos_r + 1;
    if (p->size <= p->pos_w) {
      p->pos_w = 0;
    }
  }
  else {
    p->sum = (long)(val - (&p[1].size)[p->pos_w]) + p->sum;
    (&p[1].size)[p->pos_w] = val;
    p->pos_w = p->pos_w + 1;
    if (p->size <= p->pos_w) {
      p->pos_w = 0;
    }
    p->pos_ahead = p->pos_ahead + -1;
  }
  return;
}

Assistant:

void mpp_data_update_v2(MppDataV2 *p, RK_S32 val)
{
    if (p->pos_ahead) {
        p->sum += val - p->val[p->pos_w];
        p->val[p->pos_w] = val;
        p->pos_w++;
        if (p->pos_w >= p->size)
            p->pos_w = 0;

        p->pos_ahead--;

        return;
    }

    mpp_assert(p);
    if (p->pos_r == p->size) {
        p->pos_r--;
        p->sum -= p->val[p->pos_w];
    }
    mpp_assert(p->pos_r < p->size);
    p->val[p->pos_w] = val;
    p->sum += p->val[p->pos_w];
    p->pos_w++;
    p->pos_r++;
    if (p->pos_w >= p->size)
        p->pos_w = 0;
}